

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_scalar(REF_GRID_conflict ref_grid,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  float fVar1;
  bool bVar2;
  uint64_t uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  REF_STATUS RVar8;
  int iVar9;
  size_t sVar10;
  FILE *pFVar11;
  REF_DBL *pRVar12;
  void *pvVar13;
  __off_t _Var14;
  double *data;
  int *piVar15;
  REF_DBL RVar16;
  ulong uVar17;
  uint64_t uVar18;
  ulong uVar19;
  long lVar20;
  int maxlen;
  int maxlen_00;
  undefined8 uVar21;
  void *pvVar22;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  REF_LIST pRVar23;
  double *pdVar24;
  REF_DBL RVar25;
  long lVar26;
  ulong uVar27;
  REF_MPI ref_mpi;
  REF_MPI pRVar28;
  char *pcVar29;
  REF_INT RVar30;
  REF_LIST pRVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  REF_LIST pRVar36;
  bool bVar37;
  double dVar38;
  double dVar39;
  ulong uStackY_1630;
  int local_1610;
  int local_15f8;
  char letter;
  REF_INT nvar;
  REF_INT length_1;
  float zonemarker;
  REF_LIST local_15d8;
  int version;
  undefined1 uStack_15cc;
  undefined1 uStack_15cb;
  undefined2 uStack_15ca;
  int zonetype;
  int strand;
  REF_LIST local_15b8;
  REF_INT type_1;
  int doubles;
  REF_INT RStack_15a4;
  REF_LIST zone_nnode;
  REF_INT ncell;
  double dStack_1590;
  double local_1588;
  uint64_t count;
  int notused;
  int filetype;
  REF_LIST local_1570;
  REF_INT version_2;
  undefined4 uStack_1564;
  REF_INT local_1560;
  int association;
  undefined4 uStack_1554;
  REF_INT nzone;
  int miscellaneous;
  int parent;
  int numvar;
  int aux;
  int dim_3;
  int numelem;
  int neighbor;
  int location;
  int packing;
  double *local_1528;
  undefined1 local_151c [4];
  REF_DBL v;
  REF_DBL rho;
  REF_DBL u;
  REF_INT nodes [27];
  REF_INT local;
  undefined4 uStack_434;
  
  ref_node = ref_grid->node;
  sVar10 = strlen(filename);
  if (0xc < sVar10) {
    iVar5 = strcmp(filename + (sVar10 - 0xc),".restart_sol");
    if (iVar5 != 0) goto LAB_0017238e;
    if (1 < ref_grid->mpi->n) {
      pcVar29 = "only implemented for single core";
      uVar21 = 0xa7e;
      goto LAB_00172378;
    }
    ref_cell = ref_grid->cell[3];
    pFVar11 = fopen(filename,"r");
    if (pFVar11 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar29 = "unable to open file";
      uVar21 = 0xa82;
      goto LAB_001729a3;
    }
    *ldim = 5;
    iVar5 = __isoc99_fscanf(pFVar11,"%d",&ncell);
    if (iVar5 == 1) {
      if (ncell != ref_cell->n) {
        printf("file %d ref_cell %d\n");
        pcVar29 = "ERROR: global count mismatch";
        uVar21 = 0xa88;
LAB_00172378:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar21,"ref_part_scalar_cell_restart_sol",pcVar29);
        goto LAB_00172a6f;
      }
      uVar7 = ref_node->max;
      uVar6 = *ldim * uVar7;
      if ((int)uVar6 < 0) {
        pcVar29 = "malloc *scalar of REF_DBL negative";
        uVar21 = 0xa8b;
        goto LAB_00172378;
      }
      pRVar12 = (REF_DBL *)malloc((ulong)uVar6 * 8);
      *scalar = pRVar12;
      if (pRVar12 == (REF_DBL *)0x0) {
        pcVar29 = "malloc *scalar of REF_DBL NULL";
        uVar21 = 0xa8b;
      }
      else {
        for (uVar17 = 0; uVar6 != uVar17; uVar17 = uVar17 + 1) {
          pRVar12[uVar17] = 0.0;
        }
        if ((int)uVar7 < 0) {
          pcVar29 = "malloc hits of REF_INT negative";
          uVar21 = 0xa8c;
          goto LAB_00172378;
        }
        pvVar13 = malloc((ulong)uVar7 * 4);
        if (pvVar13 != (void *)0x0) {
          for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
            *(undefined4 *)((long)pvVar13 + uVar17 * 4) = 0;
          }
          for (iVar5 = 0; iVar5 < ref_cell->max; iVar5 = iVar5 + 1) {
            RVar8 = ref_cell_nodes(ref_cell,iVar5,nodes);
            if (RVar8 == 0) {
              iVar9 = __isoc99_fscanf(pFVar11,"%lf %lf %lf %lf",&rho,&u,&v,&local);
              if (iVar9 != 4) {
                lVar26 = (long)iVar9;
                pcVar29 = "cell data read";
                uStackY_1630 = 4;
                uVar21 = 0xa91;
                goto LAB_00172a68;
              }
              uVar17 = (ulong)(uint)ref_cell->node_per;
              if (ref_cell->node_per < 1) {
                uVar17 = 0;
              }
              for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
                pRVar12 = *scalar;
                iVar9 = nodes[uVar19];
                lVar26 = (long)*ldim * (long)iVar9;
                pRVar12[lVar26] = rho + pRVar12[lVar26];
                pRVar12[lVar26 + 1] = (double)CONCAT44(u._4_4_,u._0_4_) + pRVar12[lVar26 + 1];
                pRVar12[lVar26 + 3] = v + pRVar12[lVar26 + 3];
                pRVar12[lVar26 + 4] = (double)CONCAT44(uStack_434,local) + pRVar12[lVar26 + 4];
                piVar15 = (int *)((long)pvVar13 + (long)iVar9 * 4);
                *piVar15 = *piVar15 + 1;
              }
            }
          }
          uVar19 = 0;
          uVar17 = (ulong)(uint)ref_node->max;
          if (ref_node->max < 1) {
            uVar17 = uVar19;
          }
          for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
            if (-1 < ref_node->global[uVar19]) {
              iVar5 = *(int *)((long)pvVar13 + uVar19 * 4);
              if (iVar5 < 1) {
                pcVar29 = "zero hits for node";
                uVar21 = 0xa9c;
                goto LAB_00172378;
              }
              iVar9 = *ldim * (int)uVar19;
              pRVar12 = *scalar;
              for (lVar26 = 0; lVar26 != 5; lVar26 = lVar26 + 1) {
                pRVar12[iVar9 + lVar26] = pRVar12[iVar9 + lVar26] / (double)iVar5;
              }
            }
          }
          free(pvVar13);
          iVar5 = fclose(pFVar11);
          if (iVar5 == 0) {
            return 0;
          }
          lVar26 = (long)iVar5;
          pcVar29 = "close file";
          uVar21 = 0xaa3;
          uStackY_1630 = 0;
          goto LAB_00172a68;
        }
        pcVar29 = "malloc hits of REF_INT NULL";
        uVar21 = 0xa8c;
      }
LAB_001729a3:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21
             ,"ref_part_scalar_cell_restart_sol",pcVar29);
      uStackY_1630 = 2;
    }
    else {
      lVar26 = (long)iVar5;
      pcVar29 = "read ncell";
      uStackY_1630 = 1;
      uVar21 = 0xa85;
LAB_00172a68:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21
             ,"ref_part_scalar_cell_restart_sol",pcVar29,uStackY_1630,lVar26);
LAB_00172a6f:
      uStackY_1630 = 1;
    }
    pcVar29 = "restart_sol failed";
    uVar21 = 0xcb6;
    goto LAB_001743be;
  }
  if (sVar10 < 5) {
LAB_00172416:
    uStackY_1630 = 1;
    printf("%s: %d: %s %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xcce,
           "input file name extension unknown",filename);
    pcVar29 = "unknown file extension";
    uVar21 = 0xcd0;
    goto LAB_001743be;
  }
LAB_0017238e:
  pcVar29 = filename + (sVar10 - 4);
  iVar5 = strcmp(pcVar29,".rst");
  if (iVar5 == 0) {
    pRVar28 = ref_node->ref_mpi;
    if (pRVar28->id == 0) {
      pFVar11 = fopen(filename,"r");
      if (pFVar11 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar29 = "unable to open file";
        uVar21 = 0xabc;
        goto LAB_00172a2f;
      }
      pRVar31 = (REF_LIST)fread(&ncell,4,1,pFVar11);
      if (pRVar31 == (REF_LIST)0x1) {
        pRVar31 = (REF_LIST)(long)ncell;
        printf("%d length of magic string\n",(ulong)_ncell & 0xffffffff);
        if (pRVar31 != (REF_LIST)0x8) {
          pcVar29 = "magic string length";
          pRVar23 = (REF_LIST)0x8;
          uVar21 = 0xabf;
          goto LAB_001741d2;
        }
        iVar5 = 8;
        while (bVar37 = iVar5 != 0, iVar5 = iVar5 + -1, bVar37) {
          pRVar31 = (REF_LIST)fread(&type_1,1,1,pFVar11);
          if (pRVar31 != (REF_LIST)0x1) {
            pcVar29 = "dim";
            pRVar23 = (REF_LIST)0x1;
            uVar21 = 0xac1;
            goto LAB_001741d2;
          }
          putchar((int)(char)type_1);
        }
        putchar(10);
        pRVar31 = (REF_LIST)fread(&version,4,1,pFVar11);
        if (pRVar31 != (REF_LIST)0x1) {
          pcVar29 = "dim";
          pRVar23 = (REF_LIST)0x1;
          uVar21 = 0xac5;
          goto LAB_001741d2;
        }
        pRVar31 = (REF_LIST)(long)version;
        printf("%d version\n",(ulong)(uint)version);
        if (pRVar31 != (REF_LIST)0x2) {
          pcVar29 = "version";
          pRVar23 = (REF_LIST)0x2;
          uVar21 = 0xac7;
          goto LAB_001741d2;
        }
        pRVar31 = (REF_LIST)fread(nodes,4,1,pFVar11);
        if (pRVar31 != (REF_LIST)0x1) {
          pcVar29 = "dim";
          pRVar23 = (REF_LIST)0x1;
          uVar21 = 0xac8;
          goto LAB_001741d2;
        }
        RVar30 = nodes[0];
        printf("%d dim\n",nodes._0_8_ & 0xffffffff);
        if ((RVar30 & 0xfffffffeU) == 2) {
          pRVar31 = (REF_LIST)fread(&rho,4,1,pFVar11);
          if (pRVar31 == (REF_LIST)0x1) {
            printf("%d variables\n",(ulong)rho & 0xffffffff);
            pRVar31 = (REF_LIST)fread(&u,4,1,pFVar11);
            if (pRVar31 == (REF_LIST)0x1) {
              printf("%d steps\n",(ulong)u._0_4_);
              pRVar31 = (REF_LIST)fread(&v,4,1,pFVar11);
              if (pRVar31 == (REF_LIST)0x1) {
                printf("%d dof\n",(ulong)v & 0xffffffff);
                pRVar31 = (REF_LIST)fread(&doubles,4,1,pFVar11);
                if (pRVar31 == (REF_LIST)0x1) {
                  pRVar31 = (REF_LIST)(long)doubles;
                  printf("%d doubles\n",(ulong)(uint)doubles);
                  if (pRVar31 == (REF_LIST)0x0) goto LAB_0017247a;
                  pcVar29 = "expected zero doubles";
                  uVar21 = 0xad3;
                  pRVar23 = (REF_LIST)0x0;
                }
                else {
                  pcVar29 = "doubles";
                  pRVar23 = (REF_LIST)0x1;
                  uVar21 = 0xad1;
                }
              }
              else {
                pcVar29 = "dof";
                pRVar23 = (REF_LIST)0x1;
                uVar21 = 0xacf;
              }
            }
            else {
              pcVar29 = "steps";
              pRVar23 = (REF_LIST)0x1;
              uVar21 = 0xacd;
            }
          }
          else {
            pcVar29 = "variables";
            pRVar23 = (REF_LIST)0x1;
            uVar21 = 0xacb;
          }
          goto LAB_001741d2;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xaca,"ref_part_scalar_rst","dim");
      }
      else {
        pcVar29 = "dim";
        pRVar23 = (REF_LIST)0x1;
        uVar21 = 0xabd;
LAB_001741d2:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar21,"ref_part_scalar_rst",pcVar29,pRVar23,pRVar31);
      }
      uStackY_1630 = 1;
    }
    else {
      pFVar11 = (FILE *)0x0;
LAB_0017247a:
      uVar7 = ref_mpi_bcast(pRVar28,nodes,1,1);
      if (uVar7 == 0) {
        uVar7 = ref_mpi_bcast(pRVar28,&rho,1,1);
        if (uVar7 == 0) {
          uVar7 = ref_mpi_bcast(pRVar28,&u,1,1);
          if (uVar7 == 0) {
            uStackY_1630 = 1;
            uVar7 = ref_mpi_bcast(pRVar28,&v,1,1);
            if (uVar7 == 0) {
              lVar26 = ref_node->old_n_global;
              lVar35 = (long)v._0_4_;
              iVar5 = v._0_4_;
              if (lVar26 == lVar35) {
LAB_00173efa:
                uVar7 = u._0_4_;
                iVar9 = rho._0_4_;
                *ldim = u._0_4_ * rho._0_4_;
                uVar6 = u._0_4_ * rho._0_4_ * ref_node->max;
                if (-1 < (int)uVar6) {
                  pRVar12 = (REF_DBL *)malloc((ulong)uVar6 << 3);
                  *scalar = pRVar12;
                  if (pRVar12 == (REF_DBL *)0x0) {
                    pcVar29 = "malloc *scalar of REF_DBL NULL";
                    uVar21 = 0xae6;
                  }
                  else {
                    lVar20 = (long)iVar5;
                    lVar35 = lVar20 / (long)ref_node->ref_mpi->n;
                    lVar26 = (long)(int)lVar35;
                    if (lVar35 < 100000) {
                      lVar26 = 100000;
                    }
                    if (lVar20 <= lVar26) {
                      lVar26 = lVar20;
                    }
                    uVar6 = (uint)lVar26;
                    uVar33 = iVar9 * uVar6;
                    if ((int)uVar33 < 0) {
                      pcVar29 = "malloc data of REF_DBL negative";
                      uVar21 = 0xaec;
                      goto LAB_00174c33;
                    }
                    pvVar13 = malloc((ulong)uVar33 * 8);
                    if (pvVar13 != (void *)0x0) {
                      for (uVar17 = 0; uVar33 != uVar17; uVar17 = uVar17 + 1) {
                        *(undefined8 *)((long)pvVar13 + uVar17 * 8) = 0xbff0000000000000;
                      }
                      uStackY_1630 = 1;
                      iVar9 = 0;
                      do {
                        if ((int)uVar7 <= iVar9) {
                          free(pvVar13);
                          if (pRVar28->id != 0) {
                            return 0;
                          }
                          fclose(pFVar11);
                          return 0;
                        }
                        for (lVar26 = 0; lVar26 < iVar5; lVar26 = lVar26 + (int)local_15d8) {
                          uVar33 = iVar5 - (int)lVar26;
                          if ((int)uVar6 <= (int)uVar33) {
                            uVar33 = uVar6;
                          }
                          if (ref_node->ref_mpi->id == 0) {
                            local_15d8 = (REF_LIST)(long)(int)(rho._0_4_ * uVar33);
                            pRVar31 = (REF_LIST)fread(pvVar13,8,(size_t)local_15d8,pFVar11);
                            if (pRVar31 != local_15d8) {
                              pcVar29 = "dat";
                              uVar21 = 0xaf7;
                              pRVar23 = local_15d8;
                              goto LAB_001741d2;
                            }
                            uVar7 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,rho._0_4_ * uVar6,3);
                            if (uVar7 != 0) {
                              pcVar29 = "bcast";
                              uVar21 = 0xafa;
                              goto LAB_00172ee2;
                            }
                          }
                          else {
                            uVar7 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,rho._0_4_ * uVar6,3);
                            if (uVar7 != 0) {
                              pcVar29 = "bcast";
                              uVar21 = 0xafe;
                              goto LAB_00172ee2;
                            }
                          }
                          local_15d8 = (REF_LIST)CONCAT44(local_15d8._4_4_,uVar33);
                          uVar17 = 0;
                          if (0 < (int)uVar33) {
                            uVar17 = (ulong)uVar33;
                          }
                          for (uVar19 = 0; uVar19 != uVar17; uVar19 = uVar19 + 1) {
                            uVar7 = ref_node_local(ref_node,uVar19 + lVar26,&local);
                            if ((uVar7 != 0) && (uVar7 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xb02,"ref_part_scalar_rst",(ulong)uVar7,"local");
                              uStackY_1630 = (ulong)uVar7;
                            }
                            if ((uVar7 != 5) && (uVar7 != 0)) {
                              if ((int)uStackY_1630 == 0) {
                                return 0;
                              }
                              goto LAB_001741dc;
                            }
                            if ((long)local != -1) {
                              uVar32 = 0;
                              if (0 < rho._0_4_) {
                                uVar32 = (ulong)rho & 0xffffffff;
                              }
                              for (uVar27 = 0; uVar32 != uVar27; uVar27 = uVar27 + 1) {
                                (*scalar)[(long)*ldim * (long)local +
                                          (long)(iVar9 * rho._0_4_) + uVar27] =
                                     *(REF_DBL *)
                                      ((long)pvVar13 +
                                      uVar27 * 8 + (long)((int)uVar19 * rho._0_4_) * 8);
                              }
                            }
                          }
                          iVar5 = v._0_4_;
                        }
                        iVar9 = iVar9 + 1;
                        uVar7 = u._0_4_;
                      } while( true );
                    }
                    pcVar29 = "malloc data of REF_DBL NULL";
                    uVar21 = 0xaec;
                  }
LAB_00172a2f:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar21,"ref_part_scalar_rst",pcVar29);
                  uStackY_1630 = 2;
                  goto LAB_001741dc;
                }
                pcVar29 = "malloc *scalar of REF_DBL negative";
                uVar21 = 0xae6;
              }
              else {
                if (pRVar28->id == 0) {
                  printf("file dof %d ref_node %ld %s\n",(ulong)v & 0xffffffff,lVar26,filename);
                  lVar26 = ref_node->old_n_global;
                  lVar35 = (long)v._0_4_;
                }
                iVar5 = v._0_4_;
                if (lVar26 <= lVar35) goto LAB_00173efa;
                pcVar29 = "ERROR: too small global dof";
                uVar21 = 0xae1;
              }
LAB_00174c33:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_scalar_rst",pcVar29);
            }
            else {
              pcVar29 = "bcast dim";
              uVar21 = 0xad9;
LAB_00172ee2:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_scalar_rst",(ulong)uVar7,pcVar29);
              uStackY_1630 = (ulong)uVar7;
            }
            goto LAB_001741dc;
          }
          uStackY_1630 = (ulong)uVar7;
          uVar21 = 0xad8;
        }
        else {
          uStackY_1630 = (ulong)uVar7;
          uVar21 = 0xad7;
        }
      }
      else {
        uStackY_1630 = (ulong)uVar7;
        uVar21 = 0xad6;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21
             ,"ref_part_scalar_rst",uStackY_1630,"bcast dim");
    }
LAB_001741dc:
    pcVar29 = "rst failed";
    uVar21 = 0xcba;
    goto LAB_001743be;
  }
  iVar5 = strcmp(pcVar29,".sol");
  if (iVar5 == 0) {
    pRVar28 = ref_node->ref_mpi;
    rho = -NAN;
    if (pRVar28->id == 0) {
      pFVar11 = fopen(filename,"r");
      if (pFVar11 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar29 = "unable to open file";
        uVar21 = 0xb29;
        goto LAB_00172bfa;
      }
      v = (REF_DBL)CONCAT44(v._4_4_,0xffffffff);
      do {
        iVar5 = feof(pFVar11);
        if (iVar5 != 0) {
LAB_00172c8d:
          if (v._0_4_ == -1) goto LAB_001742a1;
          pcVar29 = "SolAtVertices keyword missing from .sol metric";
          uVar21 = 0xb4e;
          goto LAB_001742c2;
        }
        iVar5 = __isoc99_fscanf(pFVar11,"%s",nodes);
        if (iVar5 != 1) {
          if (iVar5 == -1) goto LAB_00172c8d;
          lVar26 = (long)iVar5;
          pcVar29 = "line read failed";
          uStackY_1630 = 1;
          uVar21 = 0xb2f;
          goto LAB_00174393;
        }
        iVar5 = bcmp("Dimension",nodes,10);
        if (iVar5 == 0) {
          iVar5 = __isoc99_fscanf(pFVar11,"%d",&v);
          if (iVar5 != 1) {
            lVar26 = (long)iVar5;
            pcVar29 = "read dim";
            uStackY_1630 = 1;
            uVar21 = 0xb32;
            goto LAB_00174393;
          }
          printf("dim %d\n",(ulong)v & 0xffffffff);
        }
        iVar5 = bcmp("SolAtVertices",nodes,0xe);
      } while (iVar5 != 0);
      iVar5 = __isoc99_fscanf(pFVar11,"%ld",&rho);
      if (iVar5 == 1) {
        printf("nnode %d\n",(ulong)rho & 0xffffffff);
        iVar5 = __isoc99_fscanf(pFVar11,"%d",&local);
        if (iVar5 != 1) {
          lVar26 = (long)iVar5;
          pcVar29 = "read ldim";
          uStackY_1630 = 1;
          uVar21 = 0xb39;
          goto LAB_00174393;
        }
        printf("ntype %d\n",(ulong)(uint)local);
        *ldim = 0;
        for (uVar7 = 0; (int)uVar7 < local; uVar7 = uVar7 + 1) {
          iVar5 = __isoc99_fscanf(pFVar11,"%d",&ncell);
          if (iVar5 != 1) {
            lVar26 = (long)iVar5;
            pcVar29 = "read type";
            uStackY_1630 = 1;
            uVar21 = 0xb3d;
            goto LAB_00174393;
          }
          printf("%d type %d\n",(ulong)uVar7,(ulong)_ncell & 0xffffffff);
          if (ncell == 1) {
            iVar5 = 1;
          }
          else {
            if (ncell != 2) {
              printf("item %d type %d\n",(ulong)uVar7);
              pcVar29 = "solb type";
              uVar21 = 0xb45;
              goto LAB_001742c2;
            }
            iVar5 = v._0_4_;
          }
          *ldim = *ldim + iVar5;
        }
        iVar5 = __isoc99_fscanf(pFVar11,"%*[^1234567890-+.]");
        if (iVar5 < 0) {
          pcVar29 = "skip blank line";
          uVar21 = 0xb48;
        }
        else {
          if (v._0_4_ != -1) {
            printf("nnode %d ldim %d dim %d\n",(ulong)rho & 0xffffffff,(ulong)(uint)*ldim);
            goto LAB_001724da;
          }
LAB_001742a1:
          pcVar29 = "Dimension keyword missing from .sol metric";
          uVar21 = 0xb4d;
        }
LAB_001742c2:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar21,"ref_part_scalar_sol",pcVar29);
      }
      else {
        lVar26 = (long)iVar5;
        pcVar29 = "read nnode";
        uStackY_1630 = 1;
        uVar21 = 0xb37;
LAB_00174393:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar21,"ref_part_scalar_sol",pcVar29,uStackY_1630,lVar26);
      }
      uStackY_1630 = 1;
    }
    else {
      pFVar11 = (FILE *)0x0;
LAB_001724da:
      uVar7 = ref_mpi_bcast(pRVar28,&rho,1,2);
      if (uVar7 == 0) {
        uVar7 = ref_mpi_bcast(pRVar28,ldim,1,1);
        if (uVar7 == 0) {
          uStackY_1630 = 1;
          uVar7 = ref_mpi_bcast(pRVar28,&v,1,1);
          if (uVar7 == 0) {
            RVar25 = (REF_DBL)ref_node->old_n_global;
            if ((rho == RVar25) || ((REF_DBL)((long)rho / 2) == RVar25)) {
LAB_001732d2:
              iVar5 = *ldim;
              uVar7 = ref_node->max * iVar5;
              if (-1 < (int)uVar7) {
                pRVar12 = (REF_DBL *)malloc((ulong)uVar7 << 3);
                RVar25 = rho;
                *scalar = pRVar12;
                if (pRVar12 == (REF_DBL *)0x0) {
                  pcVar29 = "malloc *scalar of REF_DBL NULL";
                  uVar21 = 0xb62;
                }
                else {
                  lVar26 = (long)rho / (long)ref_node->ref_mpi->n;
                  RVar16 = (REF_DBL)(long)(int)lVar26;
                  if (lVar26 < 100000) {
                    RVar16 = 4.94065645841247e-319;
                  }
                  if ((long)rho <= (long)RVar16) {
                    RVar16 = rho;
                  }
                  iVar9 = SUB84(RVar16,0);
                  uVar7 = iVar5 * iVar9;
                  if ((int)uVar7 < 0) {
                    pcVar29 = "malloc data of REF_DBL negative";
                    uVar21 = 0xb68;
                    goto LAB_001748a7;
                  }
                  pvVar13 = malloc((ulong)uVar7 * 8);
                  if (pvVar13 != (void *)0x0) {
                    for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
                      *(undefined8 *)((long)pvVar13 + uVar17 * 8) = 0xbff0000000000000;
                    }
                    uStackY_1630 = 1;
                    for (lVar26 = 0; lVar26 < (long)RVar25; lVar26 = lVar26 + local_15f8) {
                      uVar7 = SUB84(RVar25,0) - (int)lVar26;
                      uVar17 = (ulong)uVar7;
                      if (iVar9 < (int)uVar7) {
                        uVar17 = (ulong)RVar16 & 0xffffffff;
                      }
                      local_15f8 = (int)uVar17;
                      if (ref_node->ref_mpi->id == 0) {
                        lVar35 = -1;
                        pvVar22 = pvVar13;
                        while( true ) {
                          lVar35 = lVar35 + 1;
                          if (*ldim * local_15f8 <= lVar35) break;
                          iVar5 = __isoc99_fscanf(pFVar11,"%lf",pvVar22);
                          pvVar22 = (void *)((long)pvVar22 + 8);
                          if (iVar5 != 1) {
                            lVar26 = (long)iVar5;
                            pcVar29 = "vertex data read error";
                            uStackY_1630 = 1;
                            uVar21 = 0xb6f;
                            goto LAB_00174393;
                          }
                        }
                        uVar7 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,*ldim * iVar9,3);
                        if (uVar7 != 0) {
                          pcVar29 = "bcast";
                          uVar21 = 0xb72;
                          goto LAB_00172d86;
                        }
                      }
                      else {
                        uVar7 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,*ldim * iVar9,3);
                        if (uVar7 != 0) {
                          pcVar29 = "bcast";
                          uVar21 = 0xb76;
                          goto LAB_00172d86;
                        }
                      }
                      uVar19 = 0;
                      if (0 < local_15f8) {
                        uVar19 = uVar17;
                      }
                      for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
                        uVar7 = ref_node_local(ref_node,uVar17 + lVar26,(REF_INT *)&u);
                        if ((uVar7 != 0) && (uVar7 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xb7a,"ref_part_scalar_sol",(ulong)uVar7,"local");
                          uStackY_1630 = (ulong)uVar7;
                        }
                        if ((uVar7 != 5) && (uVar7 != 0)) {
LAB_00174c05:
                          if ((int)uStackY_1630 == 0) {
                            return 0;
                          }
                          goto LAB_0017439d;
                        }
                        if (u._0_4_ != 0xffffffff) {
                          uVar7 = *ldim;
                          uVar32 = 0;
                          if (0 < (int)uVar7) {
                            uVar32 = (ulong)uVar7;
                          }
                          for (uVar27 = 0; uVar32 != uVar27; uVar27 = uVar27 + 1) {
                            (*scalar)[(long)(int)(u._0_4_ * uVar7) + uVar27] =
                                 *(REF_DBL *)
                                  ((long)pvVar13 + uVar27 * 8 + (long)(int)(uVar7 * (int)uVar17) * 8
                                  );
                          }
                        }
                        if (v._0_4_ == 2) {
                          uVar7 = ref_node_local(ref_node,uVar17 + lVar26 + (long)rho,(REF_INT *)&u)
                          ;
                          if ((uVar7 != 0) && (uVar7 != 5)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xb82,"ref_part_scalar_sol",(ulong)uVar7,"local");
                            uStackY_1630 = (ulong)uVar7;
                          }
                          if ((uVar7 != 5) && (uVar7 != 0)) goto LAB_00174c05;
                          if (u._0_4_ != 0xffffffff) {
                            uVar7 = *ldim;
                            uVar32 = 0;
                            if (0 < (int)uVar7) {
                              uVar32 = (ulong)uVar7;
                            }
                            for (uVar27 = 0; uVar32 != uVar27; uVar27 = uVar27 + 1) {
                              (*scalar)[(long)(int)(u._0_4_ * uVar7) + uVar27] =
                                   *(REF_DBL *)
                                    ((long)pvVar13 +
                                    uVar27 * 8 + (long)(int)((int)uVar17 * uVar7) * 8);
                            }
                          }
                        }
                      }
                      RVar25 = rho;
                    }
                    free(pvVar13);
                    if ((ref_node->ref_mpi->id != 0) || (iVar5 = fclose(pFVar11), iVar5 == 0)) {
                      return 0;
                    }
                    lVar26 = (long)iVar5;
                    pcVar29 = "close file";
                    uVar21 = 0xb90;
                    uStackY_1630 = 0;
                    goto LAB_00174393;
                  }
                  pcVar29 = "malloc data of REF_DBL NULL";
                  uVar21 = 0xb68;
                }
LAB_00172bfa:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar21,"ref_part_scalar_sol",pcVar29);
                uStackY_1630 = 2;
                goto LAB_0017439d;
              }
              pcVar29 = "malloc *scalar of REF_DBL negative";
              uVar21 = 0xb62;
            }
            else {
              if (pRVar28->id == 0) {
                printf("file %ld ref_node %ld %s\n",rho,RVar25,filename);
                RVar25 = (REF_DBL)ref_node->old_n_global;
              }
              if ((long)RVar25 < (long)rho) {
                if (pRVar28->id == 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xb5c,"ref_part_scalar_sol","WARNING: global count mismatch, too many");
                }
                goto LAB_001732d2;
              }
              pcVar29 = "ERROR: global count mismatch, too few";
              uVar21 = 0xb5e;
            }
LAB_001748a7:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar21,"ref_part_scalar_sol",pcVar29);
          }
          else {
            pcVar29 = "bcast dim";
            uVar21 = 0xb53;
LAB_00172d86:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar21,"ref_part_scalar_sol",(ulong)uVar7,pcVar29);
            uStackY_1630 = (ulong)uVar7;
          }
          goto LAB_0017439d;
        }
        pcVar29 = "bcast ldim";
        uVar21 = 0xb52;
      }
      else {
        pcVar29 = "bcast nnode";
        uVar21 = 0xb51;
      }
      uStackY_1630 = (ulong)uVar7;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21
             ,"ref_part_scalar_sol",uStackY_1630,pcVar29);
    }
LAB_0017439d:
    pcVar29 = "sol failed";
    uVar21 = 0xcbe;
    goto LAB_001743be;
  }
  if (5 < sVar10) {
    iVar5 = strcmp(filename + (sVar10 - 5),".solb");
    if (iVar5 == 0) {
      pRVar28 = ref_node->ref_mpi;
      rho = -NAN;
      if (pRVar28->id == 0) {
        uVar7 = ref_import_meshb_header(filename,&ncell,(REF_FILEPOS *)nodes);
        if (uVar7 != 0) {
          uStackY_1630 = (ulong)uVar7;
          pcVar29 = "head";
          uVar21 = 0xba7;
          goto LAB_001733bf;
        }
        if (2 < ncell - 2U) {
          pcVar29 = "unsupported version";
          uVar21 = 0xba8;
          goto LAB_0017352c;
        }
        pFVar11 = fopen(filename,"r");
        if (pFVar11 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          pcVar29 = "unable to open file";
          uVar21 = 0xbab;
          goto LAB_00174126;
        }
        uVar7 = ref_import_meshb_jump
                          ((FILE *)pFVar11,ncell,(REF_FILEPOS *)nodes,3,&local,(REF_FILEPOS *)&rho);
        if (uVar7 != 0) {
          uStackY_1630 = (ulong)uVar7;
          pcVar29 = "jump";
          uVar21 = 0xbae;
          goto LAB_001733bf;
        }
        if (local == 0) {
          pcVar29 = "solb missing dimension";
          uVar21 = 0xbaf;
LAB_0017352c:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar21,"ref_part_scalar_solb",pcVar29);
        }
        else {
          sVar10 = fread(&version,4,1,pFVar11);
          if (sVar10 == 1) {
            if ((version & 0xfffffffeU) == 2) {
              uVar7 = ref_import_meshb_jump
                                ((FILE *)pFVar11,ncell,(REF_FILEPOS *)nodes,0x3e,&local,
                                 (REF_FILEPOS *)&rho);
              if (uVar7 != 0) {
                uStackY_1630 = (ulong)uVar7;
                pcVar29 = "jmp";
                uVar21 = 0xbb5;
                goto LAB_001733bf;
              }
              if (local != 0) {
                uVar7 = ref_part_meshb_long((FILE *)pFVar11,ncell,(REF_LONG *)&u);
                if (uVar7 == 0) {
                  sVar10 = fread(&doubles,4,1,pFVar11);
                  if (sVar10 == 1) {
                    *ldim = 0;
                    iVar5 = 0;
                    if (0 < doubles) {
                      iVar5 = doubles;
                    }
                    while (bVar37 = iVar5 != 0, iVar5 = iVar5 + -1, bVar37) {
                      sVar10 = fread(&type_1,4,1,pFVar11);
                      pRVar31 = _type_1;
                      if (sVar10 != 1) {
                        pcVar29 = "type";
                        uVar21 = 0xbbb;
                        goto LAB_00174d17;
                      }
                      if (1 < type_1 - 1U) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xbbe,"ref_part_scalar_solb",
                               "only types 1 (scalar) or 2 (vector) supported");
                        printf(" %d type\n",(ulong)pRVar31 & 0xffffffff);
                        goto LAB_00173533;
                      }
                      iVar9 = type_1;
                      if (type_1 != 1) {
                        iVar9 = version;
                      }
                      *ldim = *ldim + iVar9;
                    }
                    ref_mpi = ref_node->ref_mpi;
                    goto LAB_0017292f;
                  }
                  pcVar29 = "ntype";
                  uVar21 = 3000;
                  goto LAB_00174d17;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,2999,"ref_part_scalar_solb",(ulong)uVar7,"nnode");
                goto LAB_00173533;
              }
              pcVar29 = "SolAtVertices missing";
              uVar21 = 0xbb6;
            }
            else {
              pcVar29 = "unsupported dimension";
              uVar21 = 0xbb1;
            }
            goto LAB_0017352c;
          }
          pcVar29 = "dim";
          uVar21 = 0xbb0;
LAB_00174d17:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar21,"ref_part_scalar_solb",pcVar29,1,sVar10);
        }
LAB_00173533:
        uStackY_1630 = 1;
      }
      else {
        pFVar11 = (FILE *)0x0;
        ref_mpi = pRVar28;
LAB_0017292f:
        uVar7 = ref_mpi_bcast(ref_mpi,&ncell,1,1);
        if (uVar7 == 0) {
          uVar7 = ref_mpi_bcast(ref_node->ref_mpi,&version,1,1);
          if (uVar7 == 0) {
            uVar7 = ref_mpi_bcast(ref_node->ref_mpi,&u,1,2);
            if (uVar7 == 0) {
              uStackY_1630 = 1;
              uVar7 = ref_mpi_bcast(ref_node->ref_mpi,ldim,1,1);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xbca,"ref_part_scalar_solb",(ulong)uVar7,"bcast ldim");
                uStackY_1630 = (ulong)uVar7;
                goto LAB_001733c9;
              }
              lVar35 = CONCAT44(u._4_4_,u._0_4_);
              lVar26 = ref_node->old_n_global;
              if ((lVar35 == lVar26) || (lVar35 / 2 == lVar26)) {
LAB_00174519:
                iVar5 = *ldim;
                uVar7 = ref_node->max * iVar5;
                if (-1 < (int)uVar7) {
                  pRVar12 = (REF_DBL *)malloc((ulong)uVar7 << 3);
                  *scalar = pRVar12;
                  if (pRVar12 == (REF_DBL *)0x0) {
                    pcVar29 = "malloc *scalar of REF_DBL NULL";
                    uVar21 = 0xbd9;
                  }
                  else {
                    uVar17 = CONCAT44(u._4_4_,u._0_4_);
                    lVar26 = (long)uVar17 / (long)ref_node->ref_mpi->n;
                    uVar19 = (ulong)(int)lVar26;
                    if (lVar26 < 100000) {
                      uVar19 = 100000;
                    }
                    if ((long)uVar17 <= (long)uVar19) {
                      uVar19 = uVar17;
                    }
                    iVar9 = (int)uVar19;
                    uVar7 = iVar5 * iVar9;
                    if ((int)uVar7 < 0) {
                      pcVar29 = "malloc data of REF_DBL negative";
                      uVar21 = 0xbdf;
                      goto LAB_00175a2e;
                    }
                    pvVar13 = malloc((ulong)uVar7 * 8);
                    if (pvVar13 != (void *)0x0) {
                      for (uVar32 = 0; uVar7 != uVar32; uVar32 = uVar32 + 1) {
                        *(undefined8 *)((long)pvVar13 + uVar32 * 8) = 0xbff0000000000000;
                      }
                      uVar7 = 0;
                      for (lVar26 = 0; lVar26 < (long)uVar17; lVar26 = lVar26 + (int)local_15d8) {
                        uVar6 = (int)uVar17 - (int)lVar26;
                        pRVar31 = (REF_LIST)(ulong)uVar6;
                        if (iVar9 < (int)uVar6) {
                          pRVar31 = (REF_LIST)(uVar19 & 0xffffffff);
                        }
                        if (ref_node->ref_mpi->id == 0) {
                          RVar25 = (REF_DBL)(long)(*ldim * (int)pRVar31);
                          RVar16 = (REF_DBL)fread(pvVar13,8,(size_t)RVar25,pFVar11);
                          if (RVar16 != RVar25) {
                            pcVar29 = "dat";
                            uVar21 = 0xbe7;
                            goto LAB_00176907;
                          }
                          uVar6 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,*ldim * iVar9,3);
                          if (uVar6 != 0) {
                            uVar21 = 0xbea;
                            goto LAB_00176847;
                          }
                        }
                        else {
                          uVar6 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,*ldim * iVar9,3);
                          if (uVar6 != 0) {
                            uVar21 = 0xbee;
LAB_00176847:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,uVar21,"ref_part_scalar_solb",(ulong)uVar6,"bcast");
                            uStackY_1630 = (ulong)uVar6;
                            goto LAB_001733c9;
                          }
                        }
                        pRVar23 = (REF_LIST)0x0;
                        if (0 < (int)pRVar31) {
                          pRVar23 = pRVar31;
                        }
                        local_15d8 = pRVar31;
                        for (pRVar36 = (REF_LIST)0x0; pRVar36 != pRVar23;
                            pRVar36 = (REF_LIST)((long)&pRVar36->n + 1)) {
                          lVar35 = (long)&pRVar36->n + lVar26;
                          uVar6 = ref_node_local(ref_node,lVar35,(REF_INT *)&v);
                          if ((uVar6 != 0) && (uVar6 != 5)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xbf2,"ref_part_scalar_solb",(ulong)uVar6,"local");
                            uVar7 = uVar6;
                          }
                          if ((uVar6 != 5) && (uVar6 != 0)) {
LAB_00175a3a:
                            uStackY_1630 = (ulong)uVar7;
                            if (uVar7 == 0) {
                              return 0;
                            }
                            goto LAB_001733c9;
                          }
                          if (v._0_4_ != -1) {
                            uVar6 = *ldim;
                            uVar17 = 0;
                            if (0 < (int)uVar6) {
                              uVar17 = (ulong)uVar6;
                            }
                            for (uVar32 = 0; uVar17 != uVar32; uVar32 = uVar32 + 1) {
                              (*scalar)[(long)(int)(v._0_4_ * uVar6) + uVar32] =
                                   *(REF_DBL *)
                                    ((long)pvVar13 +
                                    uVar32 * 8 + (long)(int)(uVar6 * (int)pRVar36) * 8);
                            }
                          }
                          if (version == 2) {
                            uVar6 = ref_node_local(ref_node,lVar35 + CONCAT44(u._4_4_,u._0_4_),
                                                   (REF_INT *)&v);
                            if ((uVar6 != 0) && (uVar6 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xbfa,"ref_part_scalar_solb",(ulong)uVar6,"local");
                              uVar7 = uVar6;
                            }
                            if ((uVar6 != 5) && (uVar6 != 0)) goto LAB_00175a3a;
                            if (v._0_4_ != -1) {
                              uVar6 = *ldim;
                              uVar17 = 0;
                              if (0 < (int)uVar6) {
                                uVar17 = (ulong)uVar6;
                              }
                              for (uVar32 = 0; uVar17 != uVar32; uVar32 = uVar32 + 1) {
                                (*scalar)[(long)(int)(v._0_4_ * uVar6) + uVar32] =
                                     *(REF_DBL *)
                                      ((long)pvVar13 +
                                      uVar32 * 8 + (long)(int)((int)pRVar36 * uVar6) * 8);
                              }
                            }
                          }
                        }
                        uVar17 = CONCAT44(u._4_4_,u._0_4_);
                      }
                      free(pvVar13);
                      RVar25 = rho;
                      if (ref_node->ref_mpi->id != 0) {
                        return 0;
                      }
                      RVar16 = (REF_DBL)ftello(pFVar11);
                      if (RVar25 == RVar16) {
                        iVar5 = fclose(pFVar11);
                        if (iVar5 == 0) {
                          return 0;
                        }
                        RVar16 = (REF_DBL)(long)iVar5;
                        pcVar29 = "close file";
                        uVar21 = 0xc09;
                        RVar25 = 0.0;
                      }
                      else {
                        pcVar29 = "end location";
                        uVar21 = 0xc08;
                      }
LAB_00176907:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,uVar21,"ref_part_scalar_solb",pcVar29,RVar25,RVar16);
                      goto LAB_001733c9;
                    }
                    pcVar29 = "malloc data of REF_DBL NULL";
                    uVar21 = 0xbdf;
                  }
LAB_00174126:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar21,"ref_part_scalar_solb",pcVar29);
                  uStackY_1630 = 2;
                  goto LAB_001733c9;
                }
                pcVar29 = "malloc *scalar of REF_DBL negative";
                uVar21 = 0xbd9;
              }
              else {
                if (pRVar28->id == 0) {
                  printf("file %ld ref_node %ld %s\n",lVar35,lVar26,filename);
                  lVar35 = CONCAT44(u._4_4_,u._0_4_);
                  lVar26 = ref_node->old_n_global;
                }
                if (lVar26 < lVar35) {
                  if (pRVar28->id == 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xbd3,"ref_part_scalar_solb","WARNING: global count mismatch, too many")
                    ;
                  }
                  goto LAB_00174519;
                }
                pcVar29 = "ERROR: global count mismatch, too few";
                uVar21 = 0xbd5;
              }
LAB_00175a2e:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_scalar_solb",pcVar29);
              uStackY_1630 = 1;
              goto LAB_001733c9;
            }
            uStackY_1630 = (ulong)uVar7;
            pcVar29 = "bcast nnode";
            uVar21 = 0xbc8;
          }
          else {
            uStackY_1630 = (ulong)uVar7;
            pcVar29 = "bcast dim";
            uVar21 = 0xbc6;
          }
        }
        else {
          uStackY_1630 = (ulong)uVar7;
          pcVar29 = "bcast version";
          uVar21 = 0xbc4;
        }
LAB_001733bf:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar21,"ref_part_scalar_solb",uStackY_1630,pcVar29);
      }
LAB_001733c9:
      pcVar29 = "solb failed";
      uVar21 = 0xcc2;
      goto LAB_001743be;
    }
    iVar5 = strcmp(filename + (sVar10 - 5),".snap");
    if (iVar5 != 0) goto LAB_001723ff;
    nodes[0] = -1;
    nodes[1] = -1;
    pRVar28 = ref_node->ref_mpi;
    if (pRVar28->id == 0) {
      pFVar11 = fopen(filename,"r");
      if (pFVar11 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar29 = "unable to open file";
        uVar21 = 0xc2a;
LAB_00173421:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar21,"ref_part_scalar_snap",pcVar29);
        uStackY_1630 = 2;
      }
      else {
        sVar10 = strlen(filename);
        iVar5 = strcmp(filename + (sVar10 - 5),".snap");
        if (iVar5 == 0) {
          pRVar31 = (REF_LIST)fread(&rho,8,1,pFVar11);
          if (pRVar31 != (REF_LIST)0x1) {
            pcVar29 = "version number";
            pRVar23 = (REF_LIST)0x1;
            uVar21 = 0xc33;
            goto LAB_0017409e;
          }
          if (((ulong)rho & 0xfffffffffffffffe) == 2) {
            version_2 = SUB84(rho,0);
            pRVar31 = (REF_LIST)fread(&u,8,1,pFVar11);
            if (pRVar31 == (REF_LIST)0x1) {
              *ldim = u._0_4_;
              pRVar28 = ref_node->ref_mpi;
              goto LAB_00172ab2;
            }
            pcVar29 = "number";
            pRVar23 = (REF_LIST)0x1;
            uVar21 = 0xc39;
            goto LAB_0017409e;
          }
          pcVar29 = "only versions 2 and 3 supported";
          uVar21 = 0xc35;
LAB_00174453:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar21,"ref_part_scalar_snap",pcVar29);
        }
        else {
          pcVar29 = "snap extension expected";
          uVar21 = 0xc2e;
LAB_00172e40:
          pRVar31 = (REF_LIST)(long)iVar5;
          pRVar23 = (REF_LIST)0x0;
LAB_0017409e:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar21,"ref_part_scalar_snap",pcVar29,pRVar23,pRVar31);
        }
        uStackY_1630 = 1;
      }
    }
    else {
      pFVar11 = (FILE *)0x0;
LAB_00172ab2:
      uVar7 = ref_mpi_bcast(pRVar28,&version_2,1,1);
      if (uVar7 == 0) {
        uStackY_1630 = 1;
        uVar7 = ref_mpi_bcast(ref_node->ref_mpi,ldim,1,1);
        if (uVar7 == 0) {
          iVar5 = *ldim;
          uVar7 = ref_node->max * iVar5;
          if (-1 < (int)uVar7) {
            pRVar12 = (REF_DBL *)malloc((ulong)uVar7 << 3);
            *scalar = pRVar12;
            if (pRVar12 != (REF_DBL *)0x0) {
              iVar9 = 0;
              uStackY_1630 = 1;
              pRVar23 = (REF_LIST)0xffffffffffffffff;
              while( true ) {
                pRVar28 = ref_node->ref_mpi;
                if (iVar5 <= iVar9) break;
                if (pRVar28->id == 0) {
                  if (version_2 == 2) {
                    pRVar31 = (REF_LIST)fread(&v,8,1,pFVar11);
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "number";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc46;
                      goto LAB_0017409e;
                    }
                    iVar5 = v._0_4_;
                    if (v._0_4_ < 1) {
                      iVar5 = 0;
                    }
                    iVar5 = iVar5 + 1;
                    while (iVar5 = iVar5 + -1, iVar5 != 0) {
                      pRVar31 = (REF_LIST)fread(&letter,1,1,pFVar11);
                      if (pRVar31 != (REF_LIST)0x1) {
                        pcVar29 = "number";
                        pRVar23 = (REF_LIST)0x1;
                        uVar21 = 0xc48;
                        goto LAB_0017409e;
                      }
                    }
                    pRVar31 = (REF_LIST)fread(&local,8,1,pFVar11);
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "number";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc4a;
                      goto LAB_0017409e;
                    }
                    lVar26 = CONCAT44(uStack_434,local);
                    _Var14 = ftello(pFVar11);
                    pRVar31 = (REF_LIST)fread(&ncell,8,1,pFVar11);
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "number";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc4c;
                      goto LAB_0017409e;
                    }
                    nodes._0_8_ = _ncell;
                    pRVar31 = (REF_LIST)fread(&association,4,1,pFVar11);
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "number";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc4e;
                      goto LAB_0017409e;
                    }
                    if ((REF_LIST)(long)association != (REF_LIST)0xffffffffffffffff) {
                      pcVar29 = "field node association only";
                      pRVar23 = (REF_LIST)0xffffffffffffffff;
                      uVar21 = 0xc4f;
                      pRVar31 = (REF_LIST)(long)association;
                      goto LAB_0017409e;
                    }
                    pRVar23 = (REF_LIST)(_Var14 + lVar26);
                  }
                  else {
                    pRVar31 = (REF_LIST)fread(&version,8,1,pFVar11);
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "length_remaining";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc57;
                      goto LAB_0017409e;
                    }
                    lVar26 = CONCAT26(uStack_15ca,
                                      CONCAT15(uStack_15cb,CONCAT14(uStack_15cc,version)));
                    _Var14 = ftello(pFVar11);
                    pRVar31 = (REF_LIST)fread(&doubles,8,1,pFVar11);
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "n_global";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc59;
                      goto LAB_0017409e;
                    }
                    pRVar31 = (REF_LIST)fread(&type_1,8,1,pFVar11);
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "entry_length_uint64";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc5c;
                      goto LAB_0017409e;
                    }
                    nodes[1] = RStack_15a4;
                    nodes[0] = doubles;
                    if (_type_1 != (REF_LIST)0x1) {
                      pcVar29 = "require entry_length == 1";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc5e;
                      pRVar31 = _type_1;
                      goto LAB_0017409e;
                    }
                    pRVar31 = (REF_LIST)fread(&count,8,1,pFVar11);
                    uVar3 = count;
                    if (pRVar31 != (REF_LIST)0x1) {
                      pcVar29 = "count";
                      pRVar23 = (REF_LIST)0x1;
                      uVar21 = 0xc60;
                      goto LAB_0017409e;
                    }
                    pRVar23 = (REF_LIST)(_Var14 + lVar26);
                    for (uVar18 = 0; uVar18 != uVar3; uVar18 = uVar18 + 1) {
                      pRVar31 = (REF_LIST)fread(&zone_nnode,8,1,pFVar11);
                      if (pRVar31 != (REF_LIST)0x1) {
                        pcVar29 = "length";
                        pRVar23 = (REF_LIST)0x1;
                        uVar21 = 0xc64;
                        goto LAB_0017409e;
                      }
                      iVar5 = (int)zone_nnode;
                      if ((int)zone_nnode < 1) {
                        iVar5 = 0;
                      }
                      iVar5 = iVar5 + 1;
                      while (iVar5 = iVar5 + -1, iVar5 != 0) {
                        pRVar31 = (REF_LIST)fread(&letter,1,1,pFVar11);
                        if (pRVar31 != (REF_LIST)0x1) {
                          pcVar29 = "number";
                          pRVar23 = (REF_LIST)0x1;
                          uVar21 = 0xc66;
                          goto LAB_0017409e;
                        }
                      }
                      pRVar31 = (REF_LIST)fread(&zone_nnode,8,1,pFVar11);
                      if (pRVar31 != (REF_LIST)0x1) {
                        pcVar29 = "length";
                        pRVar23 = (REF_LIST)0x1;
                        uVar21 = 0xc69;
                        goto LAB_0017409e;
                      }
                      iVar5 = (int)zone_nnode;
                      if ((int)zone_nnode < 1) {
                        iVar5 = 0;
                      }
                      iVar5 = iVar5 + 1;
                      while (iVar5 = iVar5 + -1, iVar5 != 0) {
                        pRVar31 = (REF_LIST)fread(&letter,1,1,pFVar11);
                        if (pRVar31 != (REF_LIST)0x1) {
                          pcVar29 = "number";
                          pRVar23 = (REF_LIST)0x1;
                          uVar21 = 0xc6b;
                          goto LAB_0017409e;
                        }
                      }
                    }
                  }
                  lVar26 = ref_node->old_n_global;
                  if ((nodes._0_8_ != lVar26) && ((long)nodes._0_8_ / 2 != lVar26)) {
                    printf("file %ld ref_node %ld\n",nodes._0_8_,lVar26);
                    pcVar29 = "global count mismatch";
                    uVar21 = 0xc78;
                    goto LAB_00174453;
                  }
                  pRVar28 = ref_node->ref_mpi;
                }
                local_15b8 = pRVar23;
                uVar7 = ref_mpi_bcast(pRVar28,nodes,1,1);
                lVar26 = nodes._0_8_;
                if (uVar7 != 0) {
                  pcVar29 = "bcast ldim";
                  uVar21 = 0xc7c;
                  goto LAB_001730ca;
                }
                lVar35 = (long)nodes._0_8_ / (long)ref_node->ref_mpi->n;
                pRVar31 = (REF_LIST)(long)(int)lVar35;
                if (lVar35 < 100000) {
                  pRVar31 = (REF_LIST)0x186a0;
                }
                if ((long)nodes._0_8_ <= (long)pRVar31) {
                  pRVar31 = (REF_LIST)nodes._0_8_;
                }
                uVar7 = (uint)pRVar31;
                if ((int)uVar7 < 0) {
                  pcVar29 = "malloc data of REF_DBL negative";
                  uVar21 = 0xc81;
                  goto LAB_00174453;
                }
                pvVar13 = malloc((ulong)(uVar7 & 0x7fffffff) << 3);
                if (pvVar13 == (void *)0x0) {
                  pcVar29 = "malloc data of REF_DBL NULL";
                  uVar21 = 0xc81;
                  goto LAB_00173421;
                }
                uVar19 = (ulong)(uVar7 & 0x7fffffff);
                for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
                  *(undefined8 *)((long)pvVar13 + uVar17 * 8) = 0xbff0000000000000;
                }
                local_15d8 = pRVar31;
                for (lVar35 = 0; uVar17 = lVar26 - lVar35, uVar17 != 0 && lVar35 <= lVar26;
                    lVar35 = lVar35 + iVar5) {
                  if ((long)uVar19 < (long)uVar17) {
                    uVar17 = uVar19;
                  }
                  RVar30 = (REF_INT)local_15d8;
                  iVar5 = (int)uVar17;
                  if (ref_node->ref_mpi->id == 0) {
                    local_1570 = (REF_LIST)(long)iVar5;
                    pRVar31 = (REF_LIST)fread(pvVar13,8,(size_t)local_1570,pFVar11);
                    if (local_1570 != pRVar31) {
                      pcVar29 = "dat";
                      uVar21 = 0xc8c;
                      pRVar23 = local_1570;
                      goto LAB_0017409e;
                    }
                    uVar7 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,RVar30,3);
                    if (uVar7 != 0) {
                      pcVar29 = "bcast";
                      uVar21 = 0xc8e;
                      goto LAB_001730ca;
                    }
                  }
                  else {
                    uVar7 = ref_mpi_bcast(ref_node->ref_mpi,pvVar13,RVar30,3);
                    if (uVar7 != 0) {
                      pcVar29 = "bcast";
                      uVar21 = 0xc91;
                      goto LAB_001730ca;
                    }
                  }
                  uVar32 = 0;
                  if (0 < iVar5) {
                    uVar32 = uVar17 & 0xffffffff;
                  }
                  for (uVar17 = 0; uVar32 != uVar17; uVar17 = uVar17 + 1) {
                    uVar7 = ref_node_local(ref_node,lVar35 + uVar17,&local_1560);
                    if ((uVar7 != 0) && (uVar7 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xc95,"ref_part_scalar_snap",(ulong)uVar7,"local");
                      uStackY_1630 = (ulong)uVar7;
                    }
                    if ((uVar7 != 5) && (uVar7 != 0)) {
                      if ((int)uStackY_1630 == 0) {
                        return 0;
                      }
                      goto LAB_001740a8;
                    }
                    if (local_1560 != -1) {
                      (*scalar)[local_1560 * *ldim + iVar9] =
                           *(REF_DBL *)((long)pvVar13 + uVar17 * 8);
                    }
                  }
                  lVar26 = nodes._0_8_;
                }
                free(pvVar13);
                if (((ref_node->ref_mpi->id == 0) && (lVar26 == ref_node->old_n_global)) &&
                   (pRVar31 = (REF_LIST)ftello(pFVar11), local_15b8 != pRVar31)) {
                  pcVar29 = "end location";
                  uVar21 = 0xca1;
                  pRVar23 = local_15b8;
                  goto LAB_0017409e;
                }
                iVar9 = iVar9 + 1;
                iVar5 = *ldim;
                pRVar23 = local_15b8;
              }
              if (pRVar28->id != 0) {
                return 0;
              }
              iVar5 = fclose(pFVar11);
              if (iVar5 == 0) {
                return 0;
              }
              pcVar29 = "close file";
              uVar21 = 0xca6;
              goto LAB_00172e40;
            }
            pcVar29 = "malloc *scalar of REF_DBL NULL";
            uVar21 = 0xc40;
            goto LAB_00173421;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xc40,"ref_part_scalar_snap","malloc *scalar of REF_DBL negative");
        }
        else {
          pcVar29 = "bcast ldim";
          uVar21 = 0xc3f;
LAB_001730ca:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar21,"ref_part_scalar_snap",(ulong)uVar7,pcVar29);
          uStackY_1630 = (ulong)uVar7;
        }
      }
      else {
        uStackY_1630 = (ulong)uVar7;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xc3d,"ref_part_scalar_snap",(ulong)uVar7,"bcast ldim");
      }
    }
LAB_001740a8:
    pcVar29 = "snap failed";
    uVar21 = 0xcc6;
    goto LAB_001743be;
  }
LAB_001723ff:
  iVar5 = strcmp(pcVar29,".plt");
  if (iVar5 != 0) goto LAB_00172416;
  pRVar28 = ref_grid->mpi;
  _type_1 = (REF_LIST)0x0;
  count = 0;
  zone_nnode = (REF_LIST)0x0;
  _local_1560 = (REF_LIST)0x0;
  uVar7 = ref_search_create((REF_SEARCH *)&association,ref_node->n);
  if (uVar7 != 0) {
    uStackY_1630 = (ulong)uVar7;
    pcVar29 = "create search";
    uVar21 = 0x9fc;
    goto LAB_001726cf;
  }
  lVar35 = 0;
  for (lVar26 = 0; lVar26 < ref_node->max; lVar26 = lVar26 + 1) {
    if ((-1 < ref_node->global[lVar26]) &&
       (uVar7 = ref_search_insert((REF_SEARCH)CONCAT44(uStack_1554,association),(REF_INT)lVar26,
                                  (REF_DBL *)((long)ref_node->real + lVar35),0.0), uVar7 != 0)) {
      uStackY_1630 = (ulong)uVar7;
      pcVar29 = "ins";
      uVar21 = 0xa01;
      goto LAB_001726cf;
    }
    lVar35 = lVar35 + 0x78;
  }
  if (pRVar28->id == 0) {
    pFVar11 = fopen(filename,"r");
    if (pFVar11 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar29 = "unable to open file";
      uVar21 = 0xa07;
LAB_00173d38:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21
             ,"ref_part_scalar_plt",pcVar29);
      uStackY_1630 = 2;
      goto LAB_001726d9;
    }
    uVar7 = ref_list_create((REF_LIST *)&type_1);
    if (uVar7 == 0) {
      uVar7 = ref_list_create((REF_LIST *)&count);
      if (uVar7 != 0) {
        uStackY_1630 = (ulong)uVar7;
        pcVar29 = "packing list";
        uVar21 = 0xa0a;
        goto LAB_001726cf;
      }
      uVar7 = ref_list_create(&zone_nnode);
      if (uVar7 != 0) {
        uStackY_1630 = (ulong)uVar7;
        pcVar29 = "nnode list";
        uVar21 = 0xa0b;
        goto LAB_001726cf;
      }
      uVar7 = ref_list_create((REF_LIST *)&local_1560);
      pRVar36 = _local_1560;
      uVar3 = count;
      pRVar23 = zone_nnode;
      pRVar31 = _type_1;
      if (uVar7 != 0) {
        uStackY_1630 = (ulong)uVar7;
        pcVar29 = "nelem list";
        uVar21 = 0xa0c;
        goto LAB_001726cf;
      }
      piVar15 = (int *)fgets((char *)&version,6,pFVar11);
      if (&version != piVar15) {
        pcVar29 = "header error";
        uVar21 = 0x919;
LAB_00175779:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar21,"ref_part_plt_header",pcVar29);
        goto LAB_00175cc5;
      }
      uStack_15cb = 0;
      iVar5 = strncmp((char *)&version,"#!TDV",5);
      if (iVar5 != 0) {
        sVar10 = (size_t)iVar5;
        pcVar29 = "header \'#!TDV\' missing";
        uVar21 = 0x91b;
LAB_00175cbb:
        uStackY_1630 = 0;
        goto LAB_00175cbe;
      }
      piVar15 = (int *)fgets((char *)&version,4,pFVar11);
      if (&version != piVar15) {
        pcVar29 = "version error";
        uVar21 = 0x91c;
        goto LAB_00175779;
      }
      uStack_15cc = 0;
      iVar5 = strncmp((char *)&version,"112",5);
      if (iVar5 != 0) {
        sVar10 = (size_t)iVar5;
        pcVar29 = "expected version \'112\'";
        uVar21 = 0x91e;
        goto LAB_00175cbb;
      }
      sVar10 = fread(&letter,4,1,pFVar11);
      if (sVar10 != 1) {
        pcVar29 = "magic";
        uStackY_1630 = 1;
        uVar21 = 0x920;
        goto LAB_00175cbe;
      }
      sVar10 = (size_t)_letter;
      if (sVar10 != 1) {
        pcVar29 = "expected little endian plt";
        uStackY_1630 = 1;
        uVar21 = 0x921;
        goto LAB_00175cbe;
      }
      sVar10 = fread(&filetype,4,1,pFVar11);
      if (sVar10 != 1) {
        pcVar29 = "filetype";
        uStackY_1630 = 1;
        uVar21 = 0x922;
        goto LAB_00175cbe;
      }
      sVar10 = (size_t)filetype;
      if (sVar10 != 0) {
        pcVar29 = "expected full filetype";
        uVar21 = 0x923;
        goto LAB_00175cbb;
      }
      uVar7 = ref_part_plt_string((FILE *)pFVar11,(char *)nodes,maxlen);
      if (uVar7 == 0) {
        sVar10 = fread(&numvar,4,1,pFVar11);
        if (sVar10 != 1) {
          pcVar29 = "numvar";
          uStackY_1630 = 1;
          uVar21 = 0x928;
          goto LAB_00175cbe;
        }
        nvar = numvar;
        iVar5 = 0;
        if (0 < numvar) {
          iVar5 = numvar;
        }
        iVar5 = iVar5 + 1;
        uVar21 = extraout_RDX;
        do {
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) {
            sVar10 = fread(&zonemarker,4,1,pFVar11);
            uVar21 = extraout_RDX_01;
            if (sVar10 == 1) goto LAB_00176d46;
            pcVar29 = "zonemarker";
            uStackY_1630 = 1;
            uVar21 = 0x931;
            goto LAB_00175cbe;
          }
          RVar8 = ref_part_plt_string((FILE *)pFVar11,(char *)&rho,(int)uVar21);
          uVar21 = extraout_RDX_00;
        } while (RVar8 == 0);
        pcVar29 = "read variable name";
        uStackY_1630 = 1;
        uVar21 = 0x92d;
      }
      else {
        uStackY_1630 = (ulong)uVar7;
        pcVar29 = "read title";
        uVar21 = 0x925;
      }
LAB_00176c6e:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21
             ,"ref_part_plt_header",uStackY_1630,pcVar29);
      goto LAB_00175cc8;
    }
    uStackY_1630 = (ulong)uVar7;
    pcVar29 = "zonetype list";
    uVar21 = 0xa09;
    goto LAB_001726cf;
  }
  pFVar11 = (FILE *)0x0;
LAB_00172cd4:
  uVar7 = ref_mpi_bcast(pRVar28,&nvar,1,1);
  if (uVar7 != 0) {
    uStackY_1630 = (ulong)uVar7;
    pcVar29 = "b nvar";
    uVar21 = 0xa1c;
    goto LAB_001726cf;
  }
  uVar7 = ref_mpi_bcast(pRVar28,&nzone,1,1);
  if (uVar7 == 0) {
    *ldim = nvar + -3;
    uVar7 = (nvar + -3) * ref_node->max;
    if (-1 < (int)uVar7) {
      pRVar12 = (REF_DBL *)malloc((ulong)uVar7 * 8);
      *scalar = pRVar12;
      if (pRVar12 == (REF_DBL *)0x0) {
        pcVar29 = "malloc *scalar of REF_DBL NULL";
        uVar21 = 0xa20;
        goto LAB_00173d38;
      }
      for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
        pRVar12[uVar17] = -999.0;
      }
      uVar7 = ref_list_create((REF_LIST *)&version_2);
      if (uVar7 == 0) {
        iVar5 = 0;
        while( true ) {
          uVar3 = count;
          pRVar23 = zone_nnode;
          pRVar31 = _type_1;
          RVar30 = nvar;
          if (nzone <= iVar5) break;
          if (pRVar28->id == 0) {
            lVar26 = (long)nvar;
            local_15d8 = _local_1560;
            v = 0.0;
            uVar7 = ref_list_create((REF_LIST *)&v);
            if (uVar7 == 0) {
              uVar7 = ref_list_shift(pRVar31,(REF_INT *)&zonemarker);
              if (uVar7 != 0) {
                pcVar29 = "zonetype";
                uVar21 = 0x97a;
                goto LAB_001765bf;
              }
              uVar7 = ref_list_shift((REF_LIST)uVar3,&parent);
              if (uVar7 == 0) {
                uVar7 = ref_list_shift(pRVar23,&strand);
                if (uVar7 == 0) {
                  uVar7 = ref_list_shift(local_15d8,&notused);
                  if (uVar7 != 0) {
                    pcVar29 = "zone elem size";
                    uVar21 = 0x97d;
                    goto LAB_00175d94;
                  }
                  if ((int)zonemarker - 1U < 5) {
                    local_15d8 = (REF_LIST)
                                 CONCAT44(local_15d8._4_4_,
                                          *(undefined4 *)
                                           (&DAT_00201acc + (ulong)((int)zonemarker - 1U) * 4));
                    length_1 = strand;
                    sVar10 = fread(&local,4,1,pFVar11);
                    if (sVar10 == 1) {
                      dVar38 = 299.0 - (double)(float)local;
                      if (dVar38 <= -dVar38) {
                        dVar38 = -dVar38;
                      }
                      if (2.99e-10 < dVar38) {
                        printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",
                               0x4072b00000000000,(double)(float)local,dVar38,0x3df48c1049e0a062,
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x99a,"ref_part_plt_data","start of data header expected");
                        goto LAB_00175d46;
                      }
                      local_1570 = (REF_LIST)0x0;
                      if (0 < RVar30) {
                        local_1570 = (REF_LIST)(ulong)(uint)RVar30;
                      }
                      local_1610 = (int)local_1570 + 1;
                      iVar9 = local_1610;
                      while (iVar9 = iVar9 + -1, iVar9 != 0) {
                        sVar10 = fread(&version,4,1,pFVar11);
                        if (sVar10 != 1) {
                          pcVar29 = "dim";
                          uStackY_1630 = 1;
                          uVar21 = 0x99d;
                          goto LAB_00175d3f;
                        }
                        uVar7 = ref_list_push((REF_LIST)v,version);
                        if (uVar7 != 0) {
                          pcVar29 = "save dataformat";
                          uVar21 = 0x99e;
                          goto LAB_00175d94;
                        }
                      }
                      sVar10 = fread(&doubles,4,1,pFVar11);
                      if (sVar10 == 1) {
                        iVar9 = local_1610;
                        if (doubles == 1) {
                          while (iVar9 + -1 != 0) {
                            sVar10 = fread(&doubles,4,1,pFVar11);
                            if (sVar10 != 1) {
                              pcVar29 = "dim";
                              uStackY_1630 = 1;
                              uVar21 = 0x9a3;
                              goto LAB_00175d3f;
                            }
                            sVar10 = (size_t)doubles;
                            iVar9 = iVar9 + -1;
                            if (sVar10 != 0) {
                              pcVar29 = "passive variable nonzero plt";
                              uVar21 = 0x9a4;
                              uStackY_1630 = 0;
                              goto LAB_00175d3f;
                            }
                          }
                        }
                        sVar10 = fread(&letter,4,1,pFVar11);
                        if (sVar10 == 1) {
                          iVar9 = local_1610;
                          if (_letter == 1) {
                            while (iVar9 + -1 != 0) {
                              sVar10 = fread(&letter,4,1,pFVar11);
                              if (sVar10 != 1) {
                                pcVar29 = "dim";
                                uStackY_1630 = 1;
                                uVar21 = 0x9aa;
                                goto LAB_00175d3f;
                              }
                              sVar10 = (size_t)_letter;
                              iVar9 = iVar9 + -1;
                              if (sVar10 != 0xffffffffffffffff) {
                                pcVar29 = "variable sharing not implemented plt";
                                uStackY_1630 = 0xffffffffffffffff;
                                uVar21 = 0x9ab;
                                goto LAB_00175d3f;
                              }
                            }
                          }
                          sVar10 = fread(&filetype,4,1,pFVar11);
                          if (sVar10 == 1) {
                            sVar10 = (size_t)filetype;
                            if (sVar10 == 0xffffffffffffffff) {
                              while (iVar9 = strand, local_1610 = local_1610 + -1, local_1610 != 0)
                              {
                                sVar10 = fread(nodes,8,1,pFVar11);
                                if (sVar10 != 1) {
                                  pcVar29 = "dim";
                                  uStackY_1630 = 1;
                                  uVar21 = 0x9b2;
                                  goto LAB_00175d3f;
                                }
                                sVar10 = fread(&rho,8,1,pFVar11);
                                if (sVar10 != 1) {
                                  pcVar29 = "dim";
                                  uStackY_1630 = 1;
                                  uVar21 = 0x9b3;
                                  goto LAB_00175d3f;
                                }
                              }
                              if (strand * RVar30 < 0) {
                                pcVar29 = "malloc *soln of REF_DBL negative";
                                uVar21 = 0x9b6;
                                goto LAB_0017670a;
                              }
                              data = (double *)malloc((ulong)(uint)(strand * RVar30) << 3);
                              if (data == (double *)0x0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0x9b6,"ref_part_plt_data","malloc *soln of REF_DBL NULL");
                                uStackY_1630 = 2;
                                goto LAB_00175da0;
                              }
                              local_1570 = (REF_LIST)((ulong)local_1570 & 0xffffffff);
                              if (parent == 0) {
                                local_1528 = data;
                                for (local_15b8 = (REF_LIST)0x0; local_15b8 != local_1570;
                                    local_15b8 = (REF_LIST)((long)&local_15b8->n + 1)) {
                                  pdVar24 = local_1528;
                                  for (lVar35 = 0; lVar35 < iVar9; lVar35 = lVar35 + 1) {
                                    iVar9 = *(int *)(*(long *)((long)v + 8) + (long)local_15b8 * 4);
                                    if (iVar9 == 2) {
                                      sVar10 = fread(&u,8,1,pFVar11);
                                      if (sVar10 != 1) {
                                        pcVar29 = "double";
                                        uStackY_1630 = 1;
                                        uVar21 = 0x9c3;
                                        goto LAB_00175d3f;
                                      }
                                      dVar38 = (double)CONCAT44(u._4_4_,u._0_4_);
                                    }
                                    else {
                                      if (iVar9 != 1) {
                                        printf("dataformat = %d\n");
                                        uVar21 = 0x9c8;
                                        goto LAB_00176a62;
                                      }
                                      sVar10 = fread(&zonetype,4,1,pFVar11);
                                      if (sVar10 != 1) {
                                        pcVar29 = "float";
                                        uStackY_1630 = 1;
                                        uVar21 = 0x9bf;
                                        goto LAB_00175d3f;
                                      }
                                      dVar38 = (double)(float)zonetype;
                                    }
                                    *pdVar24 = dVar38;
                                    pdVar24 = pdVar24 + lVar26;
                                    iVar9 = strand;
                                  }
                                  local_1528 = local_1528 + 1;
                                }
                              }
                              else {
                                pdVar24 = data;
                                for (local_15b8 = (REF_LIST)0x0; (long)local_15b8 < (long)iVar9;
                                    local_15b8 = (REF_LIST)((long)&local_15b8->n + 1)) {
                                  for (pRVar31 = (REF_LIST)0x0; local_1570 != pRVar31;
                                      pRVar31 = (REF_LIST)((long)&pRVar31->n + 1)) {
                                    iVar9 = *(int *)(*(long *)((long)v + 8) + (long)pRVar31 * 4);
                                    if (iVar9 != 2) {
                                      if (iVar9 != 1) {
                                        printf("dataformat = %d\n");
                                        uVar21 = 0x9db;
LAB_00176a62:
                                        uStackY_1630 = 6;
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,uVar21,"ref_part_plt_data",6,
                                               "implement tecplot plt dataformat read");
                                        goto LAB_00175da0;
                                      }
                                      sVar10 = fread(&zonetype,4,1,pFVar11);
                                      if (sVar10 == 1) {
                                        dVar38 = (double)(float)zonetype;
                                        goto LAB_001753bd;
                                      }
                                      pcVar29 = "float";
                                      uStackY_1630 = 1;
                                      uVar21 = 0x9d2;
                                      goto LAB_00175d3f;
                                    }
                                    sVar10 = fread(&u,8,1,pFVar11);
                                    if (sVar10 != 1) {
                                      pcVar29 = "double";
                                      uStackY_1630 = 1;
                                      uVar21 = 0x9d6;
                                      goto LAB_00175d3f;
                                    }
                                    dVar38 = (double)CONCAT44(u._4_4_,u._0_4_);
LAB_001753bd:
                                    pdVar24[(long)pRVar31] = dVar38;
                                  }
                                  pdVar24 = pdVar24 + lVar26;
                                  iVar9 = strand;
                                }
                              }
                              local_15d8 = (REF_LIST)CONCAT44(local_15d8._4_4_,(int)local_15d8 + 1);
                              for (iVar9 = 0; iVar9 < notused; iVar9 = iVar9 + 1) {
                                iVar34 = (int)local_15d8;
                                while (iVar34 = iVar34 + -1, iVar34 != 0) {
                                  sVar10 = fread(&numvar,4,1,pFVar11);
                                  if (sVar10 != 1) {
                                    pcVar29 = "dim";
                                    uStackY_1630 = 1;
                                    uVar21 = 0x9e3;
                                    goto LAB_00175d3f;
                                  }
                                }
                              }
                              ref_list_free((REF_LIST)v);
                              uVar7 = ref_mpi_bcast(pRVar28,&length_1,1,1);
                              if (uVar7 == 0) {
                                if ((length_1 < 1) ||
                                   (uVar7 = ref_mpi_bcast(pRVar28,data,length_1 * nvar,3),
                                   uVar7 == 0)) goto LAB_00174f91;
                                pcVar29 = "b soln";
                                uVar21 = 0xa2b;
                              }
                              else {
                                pcVar29 = "b length";
                                uVar21 = 0xa28;
                              }
                              goto LAB_001734fa;
                            }
                            pcVar29 = "connectivity sharing not implemented plt";
                            uStackY_1630 = 0xffffffffffffffff;
                            uVar21 = 0x9af;
                          }
                          else {
                            pcVar29 = "dim";
                            uStackY_1630 = 1;
                            uVar21 = 0x9ae;
                          }
                        }
                        else {
                          pcVar29 = "dim";
                          uStackY_1630 = 1;
                          uVar21 = 0x9a7;
                        }
                      }
                      else {
                        pcVar29 = "dim";
                        uStackY_1630 = 1;
                        uVar21 = 0x9a0;
                      }
                    }
                    else {
                      pcVar29 = "zonemarker";
                      uStackY_1630 = 1;
                      uVar21 = 0x999;
                    }
LAB_00175d3f:
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,uVar21,"ref_part_plt_data",pcVar29,uStackY_1630,sVar10);
                  }
                  else {
                    printf("zonetype = %d\n");
                    pcVar29 = "unknown tecplot plt zonetype read";
                    uVar21 = 0x991;
LAB_0017670a:
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,uVar21,"ref_part_plt_data",pcVar29);
                  }
LAB_00175d46:
                  uStackY_1630 = 1;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x97c,"ref_part_plt_data",(ulong)uVar7,"zone node size");
                  uStackY_1630 = (ulong)uVar7;
                }
              }
              else {
                pcVar29 = "zone packing";
                uVar21 = 0x97b;
LAB_00175d94:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar21,"ref_part_plt_data",(ulong)uVar7,pcVar29);
                uStackY_1630 = (ulong)uVar7;
              }
            }
            else {
              pcVar29 = "dataformats";
              uVar21 = 0x978;
LAB_001765bf:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_plt_data",(ulong)uVar7,pcVar29);
              uStackY_1630 = (ulong)uVar7;
            }
LAB_00175da0:
            pcVar29 = "read data";
            uVar21 = 0xa27;
            goto LAB_001726cf;
          }
          uVar7 = ref_mpi_bcast(pRVar28,&length_1,1,1);
          if (uVar7 != 0) {
            pcVar29 = "b length";
            uVar21 = 0xa2e;
            goto LAB_001734fa;
          }
          if (length_1 < 1) {
            data = (double *)0x0;
          }
          else {
            uVar7 = length_1 * nvar;
            if ((int)uVar7 < 0) {
              pcVar29 = "malloc soln of REF_DBL negative";
              uVar21 = 0xa30;
              goto LAB_00174937;
            }
            data = (double *)malloc((ulong)uVar7 << 3);
            if (data == (double *)0x0) {
              pcVar29 = "malloc soln of REF_DBL NULL";
              uVar21 = 0xa30;
              goto LAB_00173d38;
            }
            uVar7 = ref_mpi_bcast(pRVar28,data,uVar7,3);
            if (uVar7 != 0) {
              pcVar29 = "b soln";
              uVar21 = 0xa32;
              goto LAB_001734fa;
            }
          }
LAB_00174f91:
          iVar9 = 0;
          while (iVar9 < length_1) {
            lVar26 = (long)(nvar * iVar9);
            if (ref_grid->twod == 0) {
              for (lVar35 = 0; dVar38 = dStack_1590, lVar35 != 3; lVar35 = lVar35 + 1) {
                *(double *)(&ncell + lVar35 * 2) = data[lVar26 + lVar35];
              }
            }
            else {
              _ncell = data[lVar26];
              dStack_1590 = data[lVar26 + 2];
              local_1588 = 0.0;
              dVar38 = data[lVar26 + 2];
            }
            uVar7 = ref_search_touching((REF_SEARCH)CONCAT44(uStack_1554,association),
                                        (REF_LIST)CONCAT44(uStack_1564,version_2),(REF_DBL *)&ncell,
                                        SQRT(local_1588 * local_1588 +
                                             _ncell * _ncell + dVar38 * dVar38) * 1e-06);
            if (uVar7 != 0) {
              pcVar29 = "search tree";
              uVar21 = 0xa4e;
              goto LAB_001734fa;
            }
            pRVar31 = (REF_LIST)CONCAT44(uStack_1564,version_2);
            uVar7 = pRVar31->n;
            if (pRVar31->n < 1) {
              uVar7 = 0;
            }
            iVar34 = -1;
            dVar38 = 1e+200;
            for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
              lVar26 = (long)pRVar31->value[uVar17];
              pRVar12 = ref_node->real;
              dVar39 = SQRT((pRVar12[lVar26 * 0xf + 2] - local_1588) *
                            (pRVar12[lVar26 * 0xf + 2] - local_1588) +
                            (pRVar12[lVar26 * 0xf + 1] - dStack_1590) *
                            (pRVar12[lVar26 * 0xf + 1] - dStack_1590) +
                            (pRVar12[lVar26 * 0xf] - _ncell) * (pRVar12[lVar26 * 0xf] - _ncell));
              iVar4 = pRVar31->value[uVar17];
              if (dVar38 <= dVar39) {
                dVar39 = dVar38;
                iVar4 = iVar34;
              }
              iVar34 = iVar4;
              dVar38 = dVar39;
            }
            if (iVar34 != -1) {
              for (lVar26 = 3; lVar26 < nvar; lVar26 = lVar26 + 1) {
                (*scalar)[(long)iVar34 * (long)*ldim + lVar26 + -3] = data[nvar * iVar9 + lVar26];
              }
            }
            uVar7 = ref_list_erase(pRVar31);
            iVar9 = iVar9 + 1;
            if (uVar7 != 0) {
              pcVar29 = "erase";
              uVar21 = 0xa61;
              goto LAB_001734fa;
            }
          }
          free(data);
          iVar5 = iVar5 + 1;
        }
        uVar7 = ref_list_free((REF_LIST)CONCAT44(uStack_1564,version_2));
        if (uVar7 == 0) {
          if (pRVar28->id == 0) {
            fclose(pFVar11);
            ref_list_free(_local_1560);
            ref_list_free(zone_nnode);
            ref_list_free((REF_LIST)count);
            ref_list_free(_type_1);
          }
          uVar7 = ref_search_free((REF_SEARCH)CONCAT44(uStack_1554,association));
          if (uVar7 == 0) {
            return 0;
          }
          uStackY_1630 = (ulong)uVar7;
          pcVar29 = "free search";
          uVar21 = 0xa6f;
        }
        else {
          uStackY_1630 = (ulong)uVar7;
          pcVar29 = "free touching";
          uVar21 = 0xa65;
        }
      }
      else {
        uStackY_1630 = (ulong)uVar7;
        pcVar29 = "touching list";
        uVar21 = 0xa22;
      }
      goto LAB_001726cf;
    }
    pcVar29 = "malloc *scalar of REF_DBL negative";
    uVar21 = 0xa20;
LAB_00174937:
    uStackY_1630 = 1;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21,
           "ref_part_scalar_plt",pcVar29);
  }
  else {
    pcVar29 = "b nzone";
    uVar21 = 0xa1d;
LAB_001734fa:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21,
           "ref_part_scalar_plt",(ulong)uVar7,pcVar29);
    uStackY_1630 = (ulong)uVar7;
  }
  goto LAB_001726d9;
LAB_001770c6:
  dVar39 = (double)zonemarker;
  dVar38 = 299.0 - dVar39;
  if (dVar38 <= -dVar38) {
    dVar38 = -dVar38;
  }
  if (dVar38 < 1e-07) {
    RVar8 = ref_part_plt_string((FILE *)pFVar11,(char *)&u,(int)uVar21);
    if (RVar8 == 0) {
      sVar10 = fread(&parent,4,1,pFVar11);
      if (sVar10 == 1) {
        sVar10 = fread(&strand,4,1,pFVar11);
        if (sVar10 == 1) {
          sVar10 = fread(&doubles,8,1,pFVar11);
          if (sVar10 == 1) {
            sVar10 = fread(&notused,4,1,pFVar11);
            if (sVar10 == 1) {
              sVar10 = (size_t)notused;
              if (sVar10 == 0xffffffffffffffff) {
                sVar10 = fread(&zonetype,4,1,pFVar11);
                if (sVar10 == 1) {
                  uVar7 = ref_list_push(pRVar31,zonetype);
                  if (uVar7 == 0) {
                    sVar10 = fread(&packing,4,1,pFVar11);
                    if (sVar10 == 1) {
                      uVar7 = ref_list_push((REF_LIST)uVar3,packing);
                      if (uVar7 == 0) {
                        sVar10 = fread(&location,4,1,pFVar11);
                        if (sVar10 == 1) {
                          sVar10 = (size_t)location;
                          if (sVar10 == 0) {
                            sVar10 = fread(&neighbor,4,1,pFVar11);
                            if (sVar10 == 1) {
                              sVar10 = (size_t)neighbor;
                              if (sVar10 == 0) {
                                miscellaneous = 0;
                                iVar5 = 0;
                                while ((iVar5 <= numvar && (miscellaneous == 0))) {
                                  sVar10 = fread(&miscellaneous,4,1,pFVar11);
                                  iVar5 = iVar5 + 1;
                                  if (sVar10 != 1) {
                                    pcVar29 = "mystery";
                                    uStackY_1630 = 1;
                                    uVar21 = 0x953;
                                    goto LAB_00175cbe;
                                  }
                                }
                                uVar7 = ref_list_push(pRVar23,miscellaneous);
                                if (uVar7 == 0) {
                                  sVar10 = fread(&numelem,4,1,pFVar11);
                                  if (sVar10 == 1) {
                                    uVar7 = ref_list_push(pRVar36,numelem);
                                    if (uVar7 == 0) {
                                      iVar5 = 4;
                                      while (iVar5 = iVar5 + -1, iVar5 != 0) {
                                        sVar10 = fread(&dim_3,4,1,pFVar11);
                                        if (sVar10 != 1) {
                                          pcVar29 = "dim";
                                          uStackY_1630 = 1;
                                          uVar21 = 0x95c;
                                          goto LAB_00175cbe;
                                        }
                                        sVar10 = (size_t)dim_3;
                                        if (sVar10 != 0) {
                                          pcVar29 = "dim nonzero plt";
                                          uVar21 = 0x95d;
                                          goto LAB_00175cbb;
                                        }
                                      }
                                      sVar10 = fread(&aux,4,1,pFVar11);
                                      if (sVar10 == 1) {
                                        sVar10 = (size_t)aux;
                                        if (sVar10 == 0) goto code_r0x001770a9;
                                        pcVar29 = "aux nonzero plt";
                                        uVar21 = 0x960;
                                        goto LAB_00175cbb;
                                      }
                                      pcVar29 = "aux";
                                      uStackY_1630 = 1;
                                      uVar21 = 0x95f;
                                      goto LAB_00175cbe;
                                    }
                                    uStackY_1630 = (ulong)uVar7;
                                    pcVar29 = "save nelem";
                                    uVar21 = 0x959;
                                    goto LAB_00176c6e;
                                  }
                                  pcVar29 = "numelem";
                                  uStackY_1630 = 1;
                                  uVar21 = 0x958;
                                  goto LAB_00175cbe;
                                }
                                uStackY_1630 = (ulong)uVar7;
                                pcVar29 = "save nnode";
                                uVar21 = 0x957;
                                goto LAB_00176c6e;
                              }
                              pcVar29 = "no face neighbor  plt implemented";
                              uVar21 = 0x94d;
                              goto LAB_00175cbb;
                            }
                            pcVar29 = "neighbor";
                            uStackY_1630 = 1;
                            uVar21 = 0x94c;
                            goto LAB_00175cbe;
                          }
                          pcVar29 = "only node data location plt implemented";
                          uVar21 = 0x94b;
                          goto LAB_00175cbb;
                        }
                        pcVar29 = "location";
                        uStackY_1630 = 1;
                        uVar21 = 0x94a;
                        goto LAB_00175cbe;
                      }
                      uStackY_1630 = (ulong)uVar7;
                      pcVar29 = "save packing";
                      uVar21 = 0x949;
                      goto LAB_00176c6e;
                    }
                    pcVar29 = "packing";
                    uStackY_1630 = 1;
                    uVar21 = 0x948;
                    goto LAB_00175cbe;
                  }
                  uStackY_1630 = (ulong)uVar7;
                  pcVar29 = "save zonetype";
                  uVar21 = 0x947;
                  goto LAB_00176c6e;
                }
                pcVar29 = "zonetype";
                uStackY_1630 = 1;
                uVar21 = 0x946;
              }
              else {
                pcVar29 = "not unused should be -1 plt";
                uStackY_1630 = 0xffffffffffffffff;
                uVar21 = 0x945;
              }
            }
            else {
              pcVar29 = "notused";
              uStackY_1630 = 1;
              uVar21 = 0x944;
            }
          }
          else {
            pcVar29 = "solutiontime";
            uStackY_1630 = 1;
            uVar21 = 0x943;
          }
        }
        else {
          pcVar29 = "strand";
          uStackY_1630 = 1;
          uVar21 = 0x942;
        }
      }
      else {
        pcVar29 = "parent";
        uStackY_1630 = 1;
        uVar21 = 0x941;
      }
      goto LAB_00175cbe;
    }
    pcVar29 = "read zonename";
    uStackY_1630 = 1;
    uVar21 = 0x93e;
    goto LAB_00176c6e;
  }
  dVar38 = 357.0 - dVar39;
  if (dVar38 <= -dVar38) {
    dVar38 = -dVar38;
  }
  if (dVar38 <= 3.57e-10) {
    nzone = zone_nnode->n;
    bVar37 = false;
    for (lVar26 = 0; lVar26 < *(int *)count; lVar26 = lVar26 + 1) {
      bVar2 = !bVar37;
      bVar37 = true;
      if (bVar2) {
        bVar37 = *(int *)(*(long *)(count + 8) + lVar26 * 4) == 1;
      }
      *(undefined4 *)(*(long *)(count + 8) + lVar26 * 4) = 0;
    }
    if (bVar37) {
      puts("data packing set to block, was point");
    }
    goto LAB_00172cd4;
  }
  printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",0x4076500000000000,dVar39,
         dVar38,0x3df888691125076a,
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x965,
         "ref_part_plt_header","end of header marker expected");
  goto LAB_00175cc5;
code_r0x001770a9:
  sVar10 = fread(&zonemarker,4,1,pFVar11);
  uVar21 = extraout_RDX_03;
  if (sVar10 != 1) goto LAB_00177633;
  goto LAB_001770c6;
LAB_00177633:
  pcVar29 = "zonemarker";
  uStackY_1630 = 1;
  uVar21 = 0x962;
  goto LAB_00175cbe;
  while( true ) {
    sVar10 = fread(local_151c,4,1,pFVar11);
    if (sVar10 != 1) {
      pcVar29 = "auxiliary_value_format";
      uStackY_1630 = 1;
      uVar21 = 0x937;
      goto LAB_00175cbe;
    }
    RVar8 = ref_part_plt_string((FILE *)pFVar11,(char *)&local,maxlen_00);
    if (RVar8 != 0) {
      pcVar29 = "read auxvalue";
      uStackY_1630 = 1;
      uVar21 = 0x938;
      goto LAB_00176c6e;
    }
    sVar10 = fread(&zonemarker,4,1,pFVar11);
    uVar21 = extraout_RDX_02;
    if (sVar10 != 1) break;
LAB_00176d46:
    fVar1 = 799.0 - zonemarker;
    if (fVar1 <= -fVar1) {
      fVar1 = -fVar1;
    }
    if (1e-07 <= fVar1) goto LAB_001770c6;
    RVar8 = ref_part_plt_string((FILE *)pFVar11,(char *)&v,(int)uVar21);
    if (RVar8 != 0) {
      pcVar29 = "read auxname";
      uStackY_1630 = 1;
      uVar21 = 0x934;
      goto LAB_00176c6e;
    }
  }
  pcVar29 = "zonemarker";
  uStackY_1630 = 1;
  uVar21 = 0x93a;
LAB_00175cbe:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21,
         "ref_part_plt_header",pcVar29,uStackY_1630,sVar10);
LAB_00175cc5:
  uStackY_1630 = 1;
LAB_00175cc8:
  pcVar29 = "parse header";
  uVar21 = 0xa10;
LAB_001726cf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21,
         "ref_part_scalar_plt",uStackY_1630,pcVar29);
LAB_001726d9:
  pcVar29 = "snap failed";
  uVar21 = 0xcca;
LAB_001743be:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21,
         "ref_part_scalar",uStackY_1630,pcVar29);
  return (REF_STATUS)uStackY_1630;
}

Assistant:

REF_FCN REF_STATUS ref_part_scalar(REF_GRID ref_grid, REF_INT *ldim,
                                   REF_DBL **scalar, const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".restart_sol") == 0) {
    RSS(ref_part_scalar_cell_restart_sol(ref_grid, ldim, scalar, filename),
        "restart_sol failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".rst") == 0) {
    RSS(ref_part_scalar_rst(ref_node, ldim, scalar, filename), "rst failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".sol") == 0) {
    RSS(ref_part_scalar_sol(ref_node, ldim, scalar, filename), "sol failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0) {
    RSS(ref_part_scalar_solb(ref_node, ldim, scalar, filename), "solb failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".snap") == 0) {
    RSS(ref_part_scalar_snap(ref_node, ldim, scalar, filename), "snap failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_part_scalar_plt(ref_grid, ldim, scalar, filename), "snap failed");
    return REF_SUCCESS;
  }

  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  RSS(REF_FAILURE, "unknown file extension");
  return REF_FAILURE;
}